

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmsio.c
# Opt level: O0

void FmsIOFunctionsInitialize(FmsIOFunctions *obj)

{
  FmsIOFunctions *obj_local;
  
  if (obj != (FmsIOFunctions *)0x0) {
    obj->open = FmsIOOpen;
    obj->close = FmsIOClose;
    obj->add_int = FmsIOAddInt;
    obj->add_int_array = FmsIOAddIntArray;
    obj->add_typed_int_array = FmsIOAddTypedIntArray;
    obj->add_float = FmsIOAddFloat;
    obj->add_double = FmsIOAddDouble;
    obj->add_scalar_array = FmsIOAddScalarArray;
    obj->add_string = FmsIOAddString;
    obj->has_path = FmsIOHasPath;
    obj->get_int = FmsIOGetInt;
    obj->get_typed_int_array = FmsIOGetTypedIntArray;
    obj->get_scalar_array = FmsIOGetScalarArray;
    obj->get_string = FmsIOGetString;
  }
  return;
}

Assistant:

static void
FmsIOFunctionsInitialize(FmsIOFunctions *obj) {
  if(obj) {
    obj->open = FmsIOOpen;
    obj->close = FmsIOClose;
    obj->add_int = FmsIOAddInt;
    obj->add_int_array = FmsIOAddIntArray;
    obj->add_typed_int_array = FmsIOAddTypedIntArray;
    obj->add_float = FmsIOAddFloat;
    obj->add_double = FmsIOAddDouble;
    obj->add_scalar_array = FmsIOAddScalarArray;
    obj->add_string = FmsIOAddString;
    /*...*/
    obj->has_path = FmsIOHasPath;
    obj->get_int = FmsIOGetInt;
    obj->get_typed_int_array = FmsIOGetTypedIntArray;
    obj->get_scalar_array = FmsIOGetScalarArray;
    obj->get_string = FmsIOGetString;
  }
}